

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O0

int gzflush(gzFile file,int flush)

{
  long in_RDI;
  int err;
  gz_stream *s;
  undefined4 local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_28 = do_flush((gzFile)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      (int)((ulong)in_RDI >> 0x20));
  if (local_28 == 0) {
    fflush(*(FILE **)(in_RDI + 0x78));
    if (*(int *)(in_RDI + 0x70) == 1) {
      local_28 = 0;
    }
    else {
      local_28 = *(int *)(in_RDI + 0x70);
    }
  }
  return local_28;
}

Assistant:

int ZEXPORT gzflush (file, flush)
     gzFile file;
     int flush;
{
    gz_stream *s = (gz_stream*)file;
    int err = do_flush (file, flush);

    if (err) return err;
    fflush(s->file);
    return  s->z_err == Z_STREAM_END ? Z_OK : s->z_err;
}